

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O2

int lws_client_socket_service(lws *wsi,pollfd *pollfd)

{
  char cVar1;
  ushort uVar2;
  lws_context *plVar3;
  uchar *buf;
  allocated_headers *paVar4;
  uint buffered;
  lws_parser_return_t lVar5;
  int iVar6;
  lws *plVar7;
  long lVar8;
  ssize_t sVar9;
  int *piVar10;
  char *pcVar11;
  size_t len;
  int used;
  long lVar12;
  int n;
  char ebuf [128];
  
  plVar3 = wsi->context;
  cVar1 = wsi->tsi;
  buf = plVar3->pt[cVar1].serv_buf;
  uVar2 = (ushort)wsi->wsistate;
  iVar6 = 0;
  if (10 < uVar2 - 0x201) {
    if (uVar2 != 0x12) {
      if (uVar2 != 0x13) {
        if (uVar2 != 0x14) {
          return 0;
        }
        if ((wsi->field_0x2e2 & 1) != 0) {
          return 0;
        }
        goto LAB_00122f40;
      }
LAB_00122dcb:
      pcVar11 = lws_generate_client_handshake(wsi,(char *)buf);
      if (pcVar11 != (char *)0x0) {
        _lws_log(8,"%s: HANDSHAKE2: %p: sending headers (wsistate 0x%lx), w sock %d\n",
                 "lws_client_socket_service",wsi,(ulong)wsi->wsistate,
                 (ulong)(uint)(wsi->desc).sockfd);
        iVar6 = lws_ssl_capable_write(wsi,buf,(int)pcVar11 - (int)buf);
        if (iVar6 == -4) {
          lws_callback_on_writable(wsi);
        }
        else if (iVar6 == -1) {
          _lws_log(0x10,"ERROR writing to client socket\n");
          pcVar11 = "cws";
          goto LAB_00122e85;
        }
        if ((wsi->field_0x2e2 & 1) != 0) {
          _lws_log(0x10,"body pending\n");
          lwsi_set_state(wsi,0x14);
          lws_set_timeout(wsi,PENDING_TIMEOUT_CLIENT_ISSUE_PAYLOAD,plVar3->timeout_secs);
          if ((wsi->flags & 0x800) == 0) {
            return 0;
          }
          lws_callback_on_writable(wsi);
          return 0;
        }
        lwsi_set_state(wsi,0x20b);
        wsi->field_0x2dc = wsi->field_0x2dc & 0xfe;
        if ((short)wsi->wsistate == 0x11) {
          lwsi_set_state(wsi,0x20b);
          wsi->field_0x2dc = wsi->field_0x2dc & 0xfe;
          paVar4 = (wsi->http).ah;
          paVar4->parser_state = '`';
          paVar4->lextable_pos = 0;
          paVar4->unk_pos = 0;
          paVar4->ues = '\0';
        }
        lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,wsi->context->timeout_secs);
        lws_callback_on_writable(wsi);
LAB_00122f40:
        paVar4 = (wsi->http).ah;
        paVar4->parser_state = '`';
        paVar4->lextable_pos = 0;
        paVar4->unk_pos = 0;
        lwsi_set_state(wsi,0x20b);
        lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,plVar3->timeout_secs);
        return 0;
      }
      if (wsi->role_ops == &role_ops_raw_file || wsi->role_ops == &role_ops_raw_skt) {
        return 0;
      }
      _lws_log(1,"Failed to generate handshake for client\n");
      pcVar11 = "chs";
LAB_00122e85:
      lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,pcVar11);
      return 0;
    }
LAB_00122d42:
    iVar6 = lws_change_pollfd(wsi,4,0);
    if (iVar6 != 0) goto LAB_001230af;
    if (((wsi->tls).use_ssl & 1) == 0) {
      (wsi->tls).ssl = (lws_tls_conn *)0x0;
switchD_00122a87_caseD_204:
      if (((wsi->tls).use_ssl & 1) == 0) {
        (wsi->tls).ssl = (lws_tls_conn *)0x0;
      }
      else {
        pcVar11 = ebuf;
        iVar6 = lws_ssl_client_connect2(wsi,pcVar11,0x80);
        if (iVar6 == 0) {
          return 0;
        }
        if (iVar6 < 0) goto LAB_00123062;
      }
      if ((wsi->field_0x2e2 & 0x40) == 0) {
        lwsi_set_state(wsi,0x13);
        lws_set_timeout(wsi,PENDING_TIMEOUT_AWAITING_CLIENT_HS_SEND,plVar3->timeout_secs);
        goto LAB_00122dcb;
      }
      lws_tls_server_conn_alpn(wsi);
      iVar6 = lws_h2_issue_preface(wsi);
      if (iVar6 == 0) {
        return 0;
      }
      pcVar11 = "error sending h2 preface";
    }
    else if (((wsi->field_0x2e2 & 2) == 0) &&
            (iVar6 = lws_tls_restrict_borrow(wsi->context), iVar6 != 0)) {
      pcVar11 = "tls restriction limit";
    }
    else if (((wsi->tls).ssl == (lws_tls_conn *)0x0) &&
            (iVar6 = lws_ssl_client_bio_create(wsi), iVar6 < 0)) {
      pcVar11 = "bio_create failed";
    }
    else {
      iVar6 = lws_ssl_client_connect1(wsi);
      if (iVar6 == 0) {
        return 0;
      }
      if (-1 < iVar6) goto switchD_00122a87_caseD_204;
      pcVar11 = "lws_ssl_client_connect1 failed";
    }
    goto LAB_00123062;
  }
  switch((uint)uVar2) {
  case 0x201:
    _lws_log(1,"%s: wsi %p: WAITING_DNS\n","lws_client_socket_service",wsi);
    plVar7 = lws_client_connect_2_dnsreq(wsi);
    if (plVar7 != (lws *)0x0) {
      return 0;
    }
    _lws_log(0x100,"closed\n");
    goto LAB_001230af;
  case 0x202:
    if ((pollfd->revents & 4) == 0) {
      return 0;
    }
    lws_client_connect_3_connect(wsi,(char *)0x0,(addrinfo *)0x0,0,(void *)0x0);
    return 0;
  case 0x203:
    if ((pollfd->revents & 0x18) == 0) {
      sVar9 = recv((wsi->desc).sockfd,buf,(ulong)plVar3->pt_serv_buf_size,0);
      if ((int)(uint)sVar9 < 0) {
        piVar10 = __errno_location();
        if (*piVar10 == 0xb) {
          _lws_log(0x10,"Proxy read EAGAIN... retrying\n");
          return 0;
        }
        _lws_log(1,"ERROR reading from proxy socket\n");
        pcVar11 = "proxy read err";
      }
      else {
        plVar3->pt[cVar1].serv_buf[0xd] = '\0';
        if ((0xc < (uint)sVar9) &&
           ((iVar6 = strncmp((char *)buf,"HTTP/1.0 200 ",0xd), iVar6 == 0 ||
            (iVar6 = strncmp((char *)buf,"HTTP/1.1 200 ",0xd), iVar6 == 0)))) {
          _lws_log(8,"%s: proxy connection extablished\n","lws_client_socket_service");
          lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
          goto LAB_00122d42;
        }
        _lws_log(1,"%s: ERROR proxy did not reply with h1\n","lws_client_socket_service");
        pcVar11 = "proxy not h1";
      }
    }
    else {
      _lws_log(2,"Proxy connection %p (fd=%d) dead\n",wsi,(ulong)(uint)pollfd->fd);
      pcVar11 = "proxy conn dead";
    }
    break;
  case 0x204:
    goto switchD_00122a87_caseD_204;
  default:
    goto switchD_00122a87_caseD_205;
  case 0x20b:
    if ((pollfd->revents & 0x19U) != 0x18) {
      if ((pollfd->revents & 1U) == 0) {
        return 0;
      }
      pcVar11 = "read failed";
      do {
        if (((wsi->http).ah)->parser_state == 'd') goto LAB_00122c70;
        ebuf[0] = '\0';
        ebuf[1] = '\0';
        ebuf[2] = '\0';
        ebuf[3] = '\0';
        ebuf[4] = '\0';
        ebuf[5] = '\0';
        ebuf[6] = '\0';
        ebuf[7] = '\0';
        ebuf[8] = '\0';
        ebuf[9] = '\0';
        ebuf[10] = '\0';
        ebuf[0xb] = '\0';
        buffered = lws_buflist_aware_read
                             (plVar3->pt + cVar1,wsi,(lws_tokens *)ebuf,'\0',
                              "lws_client_socket_service");
        _lws_log(0x10,"%s: buflist-aware-read %d %d\n","lws_client_socket_service",(ulong)buffered,
                 (ulong)(uint)ebuf._8_4_);
        if (ebuf._8_4_ == -4) {
          return 0;
        }
        if ((int)(ebuf._8_4_ | buffered) < 0) goto LAB_00123062;
        if (ebuf._8_4_ == 0) {
          return 0;
        }
        n._0_1_ = ebuf[8];
        n._1_1_ = ebuf[9];
        n._2_1_ = ebuf[10];
        n._3_1_ = ebuf[0xb];
        lVar5 = lws_parse(wsi,(uchar *)ebuf._0_8_,&n);
        if (lVar5 != LPR_OK) {
          _lws_log(2,"problems parsing header\n");
          pcVar11 = "problems parsing header";
          goto LAB_00123062;
        }
        lVar12 = (long)(int)ebuf._8_4_;
        lVar8 = (long)n;
        used = (int)(lVar12 - lVar8);
        iVar6 = lws_buflist_aware_finished_consuming
                          (wsi,(lws_tokens *)ebuf,used,buffered,"lws_client_socket_service");
        if (iVar6 != 0) {
          return -1;
        }
        ebuf._0_8_ = ebuf._0_8_ + (lVar12 - lVar8);
        ebuf._8_4_ = ebuf._8_4_ - used;
      } while (n == 0);
      if (((wsi->http).ah)->parser_state != 'd') {
        __assert_fail("wsi->http.ah->parser_state == WSI_PARSING_COMPLETE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/client/client-http.c"
                      ,400,"int lws_client_socket_service(struct lws *, struct pollfd *)");
      }
LAB_00122c70:
      iVar6 = lws_client_interpret_server_handshake(wsi);
      return iVar6;
    }
    _lws_log(0x10,"Server connection %p (fd=%d) dead\n",wsi,(ulong)(uint)pollfd->fd);
    pcVar11 = "Peer hung up";
  }
LAB_00123062:
  _lws_log(8,"closing conn at LWS_CONNMODE...SERVER_REPLY\n");
  _lws_log(8,"reason: %s\n",pcVar11);
  len = strlen(pcVar11);
  lws_inform_client_conn_fail(wsi,pcVar11,len);
  lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"cbail3");
LAB_001230af:
  iVar6 = -1;
switchD_00122a87_caseD_205:
  return iVar6;
}

Assistant:

int
lws_client_socket_service(struct lws *wsi, struct lws_pollfd *pollfd)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	char *p = (char *)&pt->serv_buf[0];
#if defined(LWS_WITH_TLS)
	char ebuf[128];
#endif
	const char *cce = NULL;
	char *sb = p;
	int n = 0;

	switch (lwsi_state(wsi)) {

	case LRS_WAITING_DNS:
		/*
		 * we are under PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE
		 * timeout protection set in client-handshake.c
		 */
		lwsl_err("%s: wsi %p: WAITING_DNS\n", __func__, wsi);
		if (!lws_client_connect_2_dnsreq(wsi)) {
			/* closed */
			lwsl_client("closed\n");
			return -1;
		}

		/* either still pending connection, or changed mode */
		return 0;

	case LRS_WAITING_CONNECT:

		/*
		 * we are under PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE
		 * timeout protection set in client-handshake.c
		 */
		if (pollfd->revents & LWS_POLLOUT)
			lws_client_connect_3_connect(wsi, NULL, NULL, 0, NULL);
		break;

#if defined(LWS_WITH_SOCKS5)
	/* SOCKS Greeting Reply */
	case LRS_WAITING_SOCKS_GREETING_REPLY:
	case LRS_WAITING_SOCKS_AUTH_REPLY:
	case LRS_WAITING_SOCKS_CONNECT_REPLY:

		switch (lws_socks5c_handle_state(wsi, pollfd, &cce)) {
		case LW5CHS_RET_RET0:
			return 0;
		case LW5CHS_RET_BAIL3:
			goto bail3;
		case LW5CHS_RET_STARTHS:
			goto start_ws_handshake;
		default:
			break;
		}
		break;
#endif

	case LRS_WAITING_PROXY_REPLY:

		/* handle proxy hung up on us */

		if (pollfd->revents & LWS_POLLHUP) {

			lwsl_warn("Proxy connection %p (fd=%d) dead\n",
				  (void *)wsi, pollfd->fd);

			cce = "proxy conn dead";
			goto bail3;
		}

		n = recv(wsi->desc.sockfd, sb, context->pt_serv_buf_size, 0);
		if (n < 0) {
			if (LWS_ERRNO == LWS_EAGAIN) {
				lwsl_debug("Proxy read EAGAIN... retrying\n");
				return 0;
			}
			lwsl_err("ERROR reading from proxy socket\n");
			cce = "proxy read err";
			goto bail3;
		}

		pt->serv_buf[13] = '\0';
		if (n < 13 || (strncmp(sb, "HTTP/1.0 200 ", 13) &&
		    strncmp(sb, "HTTP/1.1 200 ", 13))) {
			lwsl_err("%s: ERROR proxy did not reply with h1\n",
					__func__);
			/* lwsl_hexdump_notice(sb, n); */
			cce = "proxy not h1";
			goto bail3;
		}

		lwsl_info("%s: proxy connection extablished\n", __func__);

		/* clear his proxy connection timeout */

		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

		/* fallthru */

	case LRS_H1C_ISSUE_HANDSHAKE:

		/*
		 * we are under PENDING_TIMEOUT_SENT_CLIENT_HANDSHAKE
		 * timeout protection set in client-handshake.c
		 *
		 * take care of our lws_callback_on_writable
		 * happening at a time when there's no real connection yet
		 */
#if defined(LWS_WITH_SOCKS5)
start_ws_handshake:
#endif
		if (lws_change_pollfd(wsi, LWS_POLLOUT, 0))
			return -1;

#if defined(LWS_WITH_TLS)
		/* we can retry this... just cook the SSL BIO the first time */

		if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {

			if (!wsi->transaction_from_pipeline_queue &&
			    lws_tls_restrict_borrow(wsi->context)) {
				cce = "tls restriction limit";
				goto bail3;
			}

			if (!wsi->tls.ssl && lws_ssl_client_bio_create(wsi) < 0) {
				cce = "bio_create failed";
				goto bail3;
			}

			n = lws_ssl_client_connect1(wsi);
			if (!n)
				return 0;
			if (n < 0) {
				cce = "lws_ssl_client_connect1 failed";
				goto bail3;
			}
		} else
			wsi->tls.ssl = NULL;

		/* fallthru */

	case LRS_WAITING_SSL:

		if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
			n = lws_ssl_client_connect2(wsi, ebuf, sizeof(ebuf));
			if (!n)
				return 0;
			if (n < 0) {
				cce = ebuf;
				goto bail3;
			}
		} else
			wsi->tls.ssl = NULL;
#endif
#if defined(LWS_WITH_DETAILED_LATENCY)
		if (context->detailed_latency_cb) {
			wsi->detlat.type = LDLT_TLS_NEG_CLIENT;
			wsi->detlat.latencies[LAT_DUR_PROXY_CLIENT_REQ_TO_WRITE] =
				lws_now_usecs() -
				wsi->detlat.earliest_write_req_pre_write;
			wsi->detlat.latencies[LAT_DUR_USERCB] = 0;
			lws_det_lat_cb(wsi->context, &wsi->detlat);
		}
#endif
#if defined (LWS_WITH_HTTP2)
		if (wsi->client_h2_alpn) {
			/*
			 * We connected to the server and set up tls, and
			 * negotiated "h2".
			 *
			 * So this is it, we are an h2 master client connection
			 * now, not an h1 client connection.
			 */
#if defined(LWS_WITH_TLS)
			lws_tls_server_conn_alpn(wsi);
#endif

			/* send the H2 preface to legitimize the connection */
			if (lws_h2_issue_preface(wsi)) {
				cce = "error sending h2 preface";
				goto bail3;
			}

			break;
		}
#endif
		lwsi_set_state(wsi, LRS_H1C_ISSUE_HANDSHAKE2);
		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_CLIENT_HS_SEND,
				context->timeout_secs);

		/* fallthru */

	case LRS_H1C_ISSUE_HANDSHAKE2:
		p = lws_generate_client_handshake(wsi, p);
		if (p == NULL) {
			if (wsi->role_ops == &role_ops_raw_skt ||
			    wsi->role_ops == &role_ops_raw_file)
				return 0;

			lwsl_err("Failed to generate handshake for client\n");
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "chs");
			return 0;
		}

		/* send our request to the server */

		lwsl_info("%s: HANDSHAKE2: %p: sending headers "
			  "(wsistate 0x%lx), w sock %d\n",
			  __func__, wsi, (unsigned long)wsi->wsistate,
			  wsi->desc.sockfd);
#if defined(LWS_WITH_DETAILED_LATENCY)
		wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif
		n = lws_ssl_capable_write(wsi, (unsigned char *)sb, (int)(p - sb));
		switch (n) {
		case LWS_SSL_CAPABLE_ERROR:
			lwsl_debug("ERROR writing to client socket\n");
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "cws");
			return 0;
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			lws_callback_on_writable(wsi);
			break;
		}

		if (wsi->client_http_body_pending) {
			lwsl_debug("body pending\n");
			lwsi_set_state(wsi, LRS_ISSUE_HTTP_BODY);
			lws_set_timeout(wsi,
					PENDING_TIMEOUT_CLIENT_ISSUE_PAYLOAD,
					context->timeout_secs);

			if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED)
				lws_callback_on_writable(wsi);
#if defined(LWS_WITH_HTTP_PROXY)
			if (wsi->http.proxy_clientside)
				lws_callback_on_writable(wsi);
#endif
			/* user code must ask for writable callback */
			break;
		}

		lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);
		wsi->hdr_parsing_completed = 0;

		if (lwsi_state(wsi) == LRS_IDLING) {
			lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);
			wsi->hdr_parsing_completed = 0;
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
			wsi->http.ah->parser_state = WSI_TOKEN_NAME_PART;
			wsi->http.ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
			wsi->http.ah->unk_pos = 0;
#endif
			/* If we're (re)starting on hdr, need other implied init */
			wsi->http.ah->ues = URIES_IDLE;
#endif
		}

		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,
				wsi->context->timeout_secs);

		lws_callback_on_writable(wsi);

		goto client_http_body_sent;

	case LRS_ISSUE_HTTP_BODY:
#if defined(LWS_WITH_HTTP_PROXY)
			if (wsi->http.proxy_clientside) {
				lws_callback_on_writable(wsi);
				break;
			}
#endif
		if (wsi->client_http_body_pending) {
			//lws_set_timeout(wsi,
			//		PENDING_TIMEOUT_CLIENT_ISSUE_PAYLOAD,
			//		context->timeout_secs);
			/* user code must ask for writable callback */
			break;
		}
client_http_body_sent:
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		/* prepare ourselves to do the parsing */
		wsi->http.ah->parser_state = WSI_TOKEN_NAME_PART;
		wsi->http.ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
		wsi->http.ah->unk_pos = 0;
#endif
#endif
		lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);
		lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,
				context->timeout_secs);
		break;

	case LRS_WAITING_SERVER_REPLY:
		/*
		 * handle server hanging up on us...
		 * but if there is POLLIN waiting, handle that first
		 */
		if ((pollfd->revents & (LWS_POLLIN | LWS_POLLHUP)) ==
								LWS_POLLHUP) {

			lwsl_debug("Server connection %p (fd=%d) dead\n",
				(void *)wsi, pollfd->fd);
			cce = "Peer hung up";
			goto bail3;
		}

		if (!(pollfd->revents & LWS_POLLIN))
			break;

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		/* interpret the server response
		 *
		 *  HTTP/1.1 101 Switching Protocols
		 *  Upgrade: websocket
		 *  Connection: Upgrade
		 *  Sec-WebSocket-Accept: me89jWimTRKTWwrS3aRrL53YZSo=
		 *  Sec-WebSocket-Nonce: AQIDBAUGBwgJCgsMDQ4PEC==
		 *  Sec-WebSocket-Protocol: chat
		 *
		 * we have to take some care here to only take from the
		 * socket bytewise.  The browser may (and has been seen to
		 * in the case that onopen() performs websocket traffic)
		 * coalesce both handshake response and websocket traffic
		 * in one packet, since at that point the connection is
		 * definitively ready from browser pov.
		 */
		while (wsi->http.ah->parser_state != WSI_PARSING_COMPLETE) {
			struct lws_tokens eb;
			int n, m, buffered;

			eb.token = NULL;
			eb.len = 0;
			buffered = lws_buflist_aware_read(pt, wsi, &eb, 0, __func__);
			lwsl_debug("%s: buflist-aware-read %d %d\n", __func__,
					buffered, eb.len);
			if (eb.len == LWS_SSL_CAPABLE_MORE_SERVICE)
				return 0;
			if (buffered < 0 || eb.len < 0) {
				cce = "read failed";
				goto bail3;
			}
			if (!eb.len)
				return 0;

			n = eb.len;
			if (lws_parse(wsi, eb.token, &n)) {
				lwsl_warn("problems parsing header\n");
				cce = "problems parsing header";
				goto bail3;
			}

			m = eb.len - n;
			if (lws_buflist_aware_finished_consuming(wsi, &eb, m,
								 buffered,
								 __func__))
			        return -1;
			eb.token += m;
			eb.len -= m;

			if (n) {
				assert(wsi->http.ah->parser_state ==
						WSI_PARSING_COMPLETE);

				break;
			}
		}

		/*
		 * hs may also be coming in multiple packets, there is a 5-sec
		 * libwebsocket timeout still active here too, so if parsing did
		 * not complete just wait for next packet coming in this state
		 */
		if (wsi->http.ah->parser_state != WSI_PARSING_COMPLETE)
			break;
#endif

		/*
		 * otherwise deal with the handshake.  If there's any
		 * packet traffic already arrived we'll trigger poll() again
		 * right away and deal with it that way
		 */
		return lws_client_interpret_server_handshake(wsi);

bail3:
		lwsl_info("closing conn at LWS_CONNMODE...SERVER_REPLY\n");
		if (cce)
			lwsl_info("reason: %s\n", cce);
		lws_inform_client_conn_fail(wsi, (void *)cce, strlen(cce));

		lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "cbail3");
		return -1;

	default:
		break;
	}

	return 0;
}